

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->CC->WorkingDirectory);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetWorkingDirectory() const
{
  return this->CC.GetWorkingDirectory();
}